

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hpp
# Opt level: O2

CaseResult * __thiscall
rc::detail::CaseResultHelper<void>::resultOf<void(*)()>
          (CaseResult *__return_storage_ptr__,CaseResultHelper<void> *this,_func_void **callable)

{
  allocator<char> local_31;
  string local_30;
  
  (**(code **)this)();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"no exceptions thrown",&local_31);
  CaseResult::CaseResult(__return_storage_ptr__,Success,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static CaseResult resultOf(const Callable &callable, Args &&... args) {
    callable(std::forward<Args>(args)...);
    return CaseResult(CaseResult::Type::Success, "no exceptions thrown");
  }